

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

void __thiscall rlib::JsonT<void>::Stringify::Format::Format(Format *this)

{
  (this->lf)._M_dataplus._M_p = (pointer)&(this->lf).field_2;
  (this->lf)._M_string_length = 0;
  (this->lf).field_2._M_local_buf[0] = '\0';
  (this->indent)._M_dataplus._M_p = (pointer)&(this->indent).field_2;
  (this->indent)._M_string_length = 0;
  (this->indent).field_2._M_local_buf[0] = '\0';
  (this->colon)._M_dataplus._M_p = (pointer)&(this->colon).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->colon,":","");
  return;
}

Assistant:

Format() {}